

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O0

void __thiscall cmCTestTestCommand::BindArguments(cmCTestTestCommand *this)

{
  static_string_view sVar1;
  cmCTestTestCommand *this_local;
  
  cmCTestHandlerCommand::BindArguments(&this->super_cmCTestHandlerCommand);
  sVar1 = ::cm::operator____s("START",5);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->Start);
  sVar1 = ::cm::operator____s("END",3);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->End);
  sVar1 = ::cm::operator____s("STRIDE",6);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->Stride);
  sVar1 = ::cm::operator____s("EXCLUDE",7);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->Exclude)
  ;
  sVar1 = ::cm::operator____s("INCLUDE",7);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->Include)
  ;
  sVar1 = ::cm::operator____s("EXCLUDE_LABEL",0xd);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ExcludeLabel);
  sVar1 = ::cm::operator____s("INCLUDE_LABEL",0xd);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->IncludeLabel);
  sVar1 = ::cm::operator____s("EXCLUDE_FIXTURE",0xf);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ExcludeFixture);
  sVar1 = ::cm::operator____s("EXCLUDE_FIXTURE_SETUP",0x15);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ExcludeFixtureSetup);
  sVar1 = ::cm::operator____s("EXCLUDE_FIXTURE_CLEANUP",0x17);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ExcludeFixtureCleanup);
  sVar1 = ::cm::operator____s("PARALLEL_LEVEL",0xe);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ParallelLevel);
  sVar1 = ::cm::operator____s("REPEAT",6);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->Repeat);
  sVar1 = ::cm::operator____s("SCHEDULE_RANDOM",0xf);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ScheduleRandom);
  sVar1 = ::cm::operator____s("STOP_TIME",9);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->StopTime
            );
  sVar1 = ::cm::operator____s("TEST_LOAD",9);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->TestLoad
            );
  sVar1 = ::cm::operator____s("RESOURCE_SPEC_FILE",0x12);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ResourceSpecFile);
  sVar1 = ::cm::operator____s("STOP_ON_FAILURE",0xf);
  cmArgumentParser<void>::Bind<bool>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->StopOnFailure);
  sVar1 = ::cm::operator____s("OUTPUT_JUNIT",0xc);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->OutputJUnit);
  return;
}

Assistant:

void cmCTestTestCommand::BindArguments()
{
  this->cmCTestHandlerCommand::BindArguments();
  this->Bind("START"_s, this->Start);
  this->Bind("END"_s, this->End);
  this->Bind("STRIDE"_s, this->Stride);
  this->Bind("EXCLUDE"_s, this->Exclude);
  this->Bind("INCLUDE"_s, this->Include);
  this->Bind("EXCLUDE_LABEL"_s, this->ExcludeLabel);
  this->Bind("INCLUDE_LABEL"_s, this->IncludeLabel);
  this->Bind("EXCLUDE_FIXTURE"_s, this->ExcludeFixture);
  this->Bind("EXCLUDE_FIXTURE_SETUP"_s, this->ExcludeFixtureSetup);
  this->Bind("EXCLUDE_FIXTURE_CLEANUP"_s, this->ExcludeFixtureCleanup);
  this->Bind("PARALLEL_LEVEL"_s, this->ParallelLevel);
  this->Bind("REPEAT"_s, this->Repeat);
  this->Bind("SCHEDULE_RANDOM"_s, this->ScheduleRandom);
  this->Bind("STOP_TIME"_s, this->StopTime);
  this->Bind("TEST_LOAD"_s, this->TestLoad);
  this->Bind("RESOURCE_SPEC_FILE"_s, this->ResourceSpecFile);
  this->Bind("STOP_ON_FAILURE"_s, this->StopOnFailure);
  this->Bind("OUTPUT_JUNIT"_s, this->OutputJUnit);
}